

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  string_view name;
  ElemSegment *pEVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  Var *this_00;
  ElemSegmentModuleField *local_170;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_168;
  string initial_name;
  Location loc;
  string segment_name;
  Var local_100;
  Var local_b8;
  Var local_70;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar4 = Expect(this,Elem);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  initial_name._M_dataplus._M_p = (pointer)&initial_name.field_2;
  initial_name._M_string_length = 0;
  initial_name.field_2._M_local_buf[0] = '\0';
  bVar2 = ParseBindVarOpt(this,&initial_name);
  std::__cxx11::string::string((string *)&segment_name,(string *)&initial_name);
  if ((this->options_->features).bulk_memory_enabled_ == false) {
    std::__cxx11::string::assign((char *)&segment_name);
  }
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((wabt *)&local_170,&loc,&segment_name);
  if (((this->options_->features).reference_types_enabled_ == true) &&
     (bVar3 = Match(this,Declare), bVar3)) {
    (local_170->elem_segment).kind = Declared;
  }
  if ((this->options_->features).bulk_memory_enabled_ == true) {
    bVar2 = PeekMatchLpar(this,Table);
    if (!bVar2) {
      this_00 = &local_70;
LAB_00176605:
      pEVar1 = &local_170->elem_segment;
      Var::Var(this_00,0,&loc);
      ParseVarOpt(this,&pEVar1->table_var,this_00);
      goto LAB_00176625;
    }
    RVar4 = Expect(this,Lpar);
    EVar5 = Error;
    if ((((RVar4.enum_ == Error) || (RVar4 = Expect(this,Table), RVar4.enum_ == Error)) ||
        (RVar4 = ParseVar(this,&(local_170->elem_segment).table_var), RVar4.enum_ == Error)) ||
       (RVar4 = Expect(this,Rpar), RVar4.enum_ == Error)) goto LAB_00176701;
  }
  else {
    if (!bVar2) {
      this_00 = &local_100;
      goto LAB_00176605;
    }
    name.size_ = initial_name._M_string_length;
    name.data_ = initial_name._M_dataplus._M_p;
    this_00 = &local_b8;
    Var::Var(this_00,name,&loc);
    Var::operator=(&(local_170->elem_segment).table_var,this_00);
LAB_00176625:
    Var::~Var(this_00);
  }
  if (((local_170->elem_segment).kind != Declared) &&
     (bVar2 = ParseOffsetExprOpt(this,&(local_170->elem_segment).offset), !bVar2)) {
    (local_170->elem_segment).kind = Passive;
  }
  bVar2 = ParseRefTypeOpt(this,&(local_170->elem_segment).elem_type);
  if (bVar2) {
    ParseElemExprListOpt(this,&(local_170->elem_segment).elem_exprs);
LAB_001766b8:
    RVar4 = Expect(this,Rpar);
    if (RVar4.enum_ != Error) {
      local_168._M_head_impl = local_170;
      local_170 = (ElemSegmentModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)&local_168);
      if (local_168._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*((local_168._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_168._M_head_impl = (ElemSegmentModuleField *)0x0;
      EVar5 = Ok;
      goto LAB_00176701;
    }
  }
  else {
    (local_170->elem_segment).elem_type.enum_ = Funcref;
    bVar2 = PeekMatch(this,Func);
    if ((!bVar2) || (RVar4 = Expect(this,Func), RVar4.enum_ != Error)) {
      ParseElemExprVarListOpt(this,&(local_170->elem_segment).elem_exprs);
      goto LAB_001766b8;
    }
  }
  EVar5 = Error;
LAB_00176701:
  if (local_170 != (ElemSegmentModuleField *)0x0) {
    (*(local_170->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);

  // With MVP text format the name here was intended to refer to the table
  // that the elem segment was part of, but we never did anything with this name
  // since there was only one table anyway.
  // With bulk-memory enabled this introduces a new name for the particular
  // elem segment.
  std::string initial_name;
  bool has_name = ParseBindVarOpt(&initial_name);

  std::string segment_name = initial_name;
  if (!options_->features.bulk_memory_enabled()) {
    segment_name = "";
  }
  auto field = MakeUnique<ElemSegmentModuleField>(loc, segment_name);
  if (options_->features.reference_types_enabled() &&
      Match(TokenType::Declare)) {
    field->elem_segment.kind = SegmentKind::Declared;
  }

  // Optional table specifier
  if (options_->features.bulk_memory_enabled()) {
    if (PeekMatchLpar(TokenType::Table)) {
      EXPECT(Lpar);
      EXPECT(Table);
      CHECK_RESULT(ParseVar(&field->elem_segment.table_var));
      EXPECT(Rpar);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  } else {
    if (has_name) {
      field->elem_segment.table_var = Var(initial_name, loc);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  }

  if ((field->elem_segment.kind != SegmentKind::Declared) &&
      !ParseOffsetExprOpt(&field->elem_segment.offset)) {
    field->elem_segment.kind = SegmentKind::Passive;
  }

  if (ParseRefTypeOpt(&field->elem_segment.elem_type)) {
    ParseElemExprListOpt(&field->elem_segment.elem_exprs);
  } else {
    field->elem_segment.elem_type = Type::Funcref;
    if (PeekMatch(TokenType::Func)) {
      EXPECT(Func);
    }
    ParseElemExprVarListOpt(&field->elem_segment.elem_exprs);
  }
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}